

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::RandomOrderTexImageCubeCase::createTexture
          (RandomOrderTexImageCubeCase *this)

{
  int iVar1;
  CubeFace CVar2;
  deUint32 internalFormat;
  deUint32 format;
  deUint32 type;
  deUint32 dVar3;
  int width;
  char *str;
  reference pvVar4;
  iterator first;
  iterator last;
  size_type sVar5;
  void *data;
  PixelBufferAccess local_130;
  PixelBufferAccess local_108;
  undefined1 local_e0 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelSize;
  CubeFace face_1;
  int levelNdx;
  int ndx_1;
  CubeFace local_a0;
  pair<int,_tcu::CubeFace> local_9c;
  CubeFace local_94;
  int local_90;
  int face;
  int ndx;
  vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_> images;
  undefined1 local_60 [8];
  Random rnd;
  undefined1 local_48 [8];
  TextureLevel levelData;
  deUint32 tex;
  RandomOrderTexImageCubeCase *this_local;
  
  levelData.m_data.m_cap._4_4_ = 0;
  rnd.m_rnd._8_8_ = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_48,(TextureFormat *)&rnd.m_rnd.z);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)local_60,dVar3);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&levelData.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x8513,
             levelData.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  iVar1 = (this->super_TextureCubeSpecCase).m_numLevels;
  std::allocator<std::pair<int,_tcu::CubeFace>_>::allocator
            ((allocator<std::pair<int,_tcu::CubeFace>_> *)((long)&face + 3));
  std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
  vector((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_> *)
         &ndx,(long)(iVar1 * 6),(allocator<std::pair<int,_tcu::CubeFace>_> *)((long)&face + 3));
  std::allocator<std::pair<int,_tcu::CubeFace>_>::~allocator
            ((allocator<std::pair<int,_tcu::CubeFace>_> *)((long)&face + 3));
  for (local_90 = 0; local_90 < (this->super_TextureCubeSpecCase).m_numLevels;
      local_90 = local_90 + 1) {
    for (local_94 = CUBEFACE_NEGATIVE_X; (int)local_94 < 6;
        local_94 = local_94 + CUBEFACE_POSITIVE_X) {
      local_a0 = local_94;
      local_9c = std::make_pair<int&,tcu::CubeFace>(&local_90,&local_a0);
      pvVar4 = std::
               vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
               ::operator[]((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                             *)&ndx,(long)(int)(local_90 * 6 + local_94));
      std::pair<int,_tcu::CubeFace>::operator=(pvVar4,&local_9c);
    }
  }
  first = std::
          vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
          begin((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                 *)&ndx);
  last = std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
         ::end((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                *)&ndx);
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<std::pair<int,tcu::CubeFace>*,std::vector<std::pair<int,tcu::CubeFace>,std::allocator<std::pair<int,tcu::CubeFace>>>>>
            ((Random *)local_60,
             (__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
              )first._M_current,
             (__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
              )last._M_current);
  face_1 = CUBEFACE_NEGATIVE_X;
  while( true ) {
    sVar5 = std::
            vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
            size((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                  *)&ndx);
    if ((int)sVar5 <= (int)face_1) break;
    pvVar4 = std::
             vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
             ::operator[]((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                           *)&ndx,(long)(int)face_1);
    iVar1 = pvVar4->first;
    pvVar4 = std::
             vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
             ::operator[]((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                           *)&ndx,(long)(int)face_1);
    CVar2 = pvVar4->second;
    levelSize._0_1_ = (byte)iVar1;
    width = de::max<int>(1,(this->super_TextureCubeSpecCase).m_size >> ((byte)levelSize & 0x1f));
    randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)local_60,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax);
    randomVector<4>((Functional *)local_e0,(Random *)local_60,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax);
    tcu::TextureLevel::setSize((TextureLevel *)local_48,width,width,1);
    tcu::TextureLevel::getAccess(&local_108,(TextureLevel *)local_48);
    tcu::fillWithComponentGradients(&local_108,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_e0);
    dVar3 = *(deUint32 *)(s_cubeMapFaces + (ulong)CVar2 * 4);
    internalFormat = this->m_internalFormat;
    format = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_130,(TextureLevel *)local_48);
    data = tcu::PixelBufferAccess::getDataPtr(&local_130);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,dVar3,
               iVar1,internalFormat,width,width,0,format,type,data);
    face_1 = face_1 + CUBEFACE_POSITIVE_X;
  }
  std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
  ~vector((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_> *)
          &ndx);
  de::Random::~Random((Random *)local_60);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_48);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Level-face pairs.
		vector<pair<int, tcu::CubeFace> >	images	(m_numLevels*6);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				images[ndx*6 + face] = std::make_pair(ndx, (tcu::CubeFace)face);

		rnd.shuffle(images.begin(), images.end());

		for (int ndx = 0; ndx < (int)images.size(); ndx++)
		{
			int				levelNdx	= images[ndx].first;
			tcu::CubeFace	face		= images[ndx].second;
			int				levelSize	= de::max(1, m_size >> levelNdx);
			Vec4			gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4			gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelSize, levelSize);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(s_cubeMapFaces[face], levelNdx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}